

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O1

VectorXi __thiscall ear::argSort(ear *this,VectorXd *v)

{
  ulong uVar1;
  int iVar2;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index extraout_RDX_01;
  Index IVar3;
  pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *low;
  long lVar4;
  pointer piVar5;
  pointer piVar6;
  VectorXi VVar7;
  pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> ret;
  undefined1 local_88 [32];
  pointer local_68 [2];
  pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_58;
  pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_48;
  pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_38;
  
  uVar1 = (v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  iVar2 = (int)uVar1;
  piVar6 = (pointer)(long)iVar2;
  local_48.m_ptr = (pointer)((ulong)local_48.m_ptr & 0xffffffff00000000);
  local_58.m_ptr = (pointer)CONCAT44(local_58.m_ptr._4_4_,iVar2);
  low = &local_48;
  if ((uVar1 & 0xffffffff) == 1) {
    low = &local_58;
  }
  Eigen::internal::linspaced_op_impl<int,_true>::linspaced_op_impl
            ((linspaced_op_impl<int,_true> *)local_68,(int *)low,(int *)&local_58,(Index)piVar6);
  local_88._12_8_ = local_68[0];
  local_88._20_8_ = local_68[1];
  local_88._0_8_ = piVar6;
  if ((long)piVar6 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<int>, Eigen::Matrix<int, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::linspaced_op<int>, MatrixType = Eigen::Matrix<int, -1, 1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)this,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
              *)local_88);
  uVar1 = *(ulong *)(this + 8);
  IVar3 = extraout_RDX;
  if (uVar1 != 0) {
    piVar6 = *(pointer *)this;
    lVar4 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    local_58.m_ptr = piVar6;
    local_38.m_ptr = piVar6 + uVar1;
    std::
    __introsort_loop<Eigen::internal::pointer_based_stl_iterator<Eigen::Matrix<int,_1,1,0,_1,1>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ear::argSort(Eigen::Matrix<double,_1,1,0,_1,1>const&)::__0>>
              (&local_58,&local_38,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:34:15)>
                )v);
    if ((long)uVar1 < 0x11) {
      local_88._0_8_ = piVar6;
      local_68[0] = piVar6 + uVar1;
      std::
      __insertion_sort<Eigen::internal::pointer_based_stl_iterator<Eigen::Matrix<int,_1,1,0,_1,1>>,__gnu_cxx::__ops::_Iter_comp_iter<ear::argSort(Eigen::Matrix<double,_1,1,0,_1,1>const&)::__0>>
                ((pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_88,
                 (pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_68,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:34:15)>
                  )v);
      IVar3 = extraout_RDX_01;
    }
    else {
      piVar5 = piVar6 + 0x10;
      local_68[0] = piVar6;
      local_48.m_ptr = piVar5;
      std::
      __insertion_sort<Eigen::internal::pointer_based_stl_iterator<Eigen::Matrix<int,_1,1,0,_1,1>>,__gnu_cxx::__ops::_Iter_comp_iter<ear::argSort(Eigen::Matrix<double,_1,1,0,_1,1>const&)::__0>>
                ((pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_68,
                 &local_48,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:34:15)>
                  )v);
      lVar4 = uVar1 * 4 + -0x40;
      do {
        local_88._0_8_ = piVar5;
        std::
        __unguarded_linear_insert<Eigen::internal::pointer_based_stl_iterator<Eigen::Matrix<int,_1,1,0,_1,1>>,__gnu_cxx::__ops::_Val_comp_iter<ear::argSort(Eigen::Matrix<double,_1,1,0,_1,1>const&)::__0>>
                  ((pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_88,
                   (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:34:15)>
                    )v);
        piVar5 = piVar5 + 1;
        lVar4 = lVar4 + -4;
        IVar3 = extraout_RDX_00;
      } while (lVar4 != 0);
    }
  }
  VVar7.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar3;
  VVar7.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)this;
  return (VectorXi)VVar7.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXi argSort(const Eigen::VectorXd& v) {
    Eigen::VectorXi indices = Eigen::VectorXi::LinSpaced(
        static_cast<int>(v.size()), 0, static_cast<int>(v.size()));
    std::sort(indices.begin(), indices.end(),
              [&v](size_t i1, size_t i2) { return v[i1] < v[i2]; });
    return indices;
  }